

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::InnerProduct3D_1D_1D::dim_forward
          (Dim *__return_storage_ptr__,InnerProduct3D_1D_1D *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  uint uVar6;
  initializer_list<unsigned_int> x;
  string local_1b0 [32];
  ostringstream s;
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pDVar1;
  if (1 < lVar3 / 0x24 - 3U) {
    piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10,this,lVar3 % 0x24);
    std::invalid_argument::invalid_argument
              (piVar5,"Expected three or four arguments in InnerProduct3D_1D");
    __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((pDVar1->nd == 3) && (pDVar1[1].nd == 1)) && (pDVar1[2].nd == 1)) {
    _s = pDVar1->d[0];
    uVar6 = pDVar1[1].bd;
    if (pDVar1[1].bd < pDVar1->bd) {
      uVar6 = pDVar1->bd;
    }
    if (uVar6 <= pDVar1[2].bd) {
      uVar6 = pDVar1[2].bd;
    }
    x._M_len = 1;
    x._M_array = (iterator)&s;
    Dim::Dim(__return_storage_ptr__,x,uVar6);
    pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pDVar1 == 0x90) {
      uVar6 = pDVar1[3].bd;
      if (pDVar1[3].bd < __return_storage_ptr__->bd) {
        uVar6 = __return_storage_ptr__->bd;
      }
      __return_storage_ptr__->bd = uVar6;
      bVar2 = operator!=(pDVar1 + 3,__return_storage_ptr__);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
        poVar4 = std::operator<<((ostream *)&s,"Bad input dimensions in InnerProduct3D_1D_1D: ");
        operator<<(poVar4,xs);
        piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(piVar5,local_1b0);
        __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar4 = std::operator<<((ostream *)&s,"Bad input dimensions in InnerProduct3D_1D_1D: ");
  operator<<(poVar4,xs);
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar5,local_1b0);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim InnerProduct3D_1D_1D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 3 && xs.size() != 4)
    throw std::invalid_argument("Expected three or four arguments in InnerProduct3D_1D");
  if (xs[0].ndims() != 3 ||
      xs[1].ndims() != 1 ||
      xs[2].ndims() != 1) {
    // TODO fix add check
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  Dim d({xs[0].size(0)}, max(max(xs[0].bd, xs[1].bd), xs[2].bd));
  if(xs.size() == 4) d.bd = max(d.bd, xs[3].bd);
  if (xs.size() == 4 && xs[3] != d) {
    ostringstream s; s << "Bad input dimensions in InnerProduct3D_1D_1D: " << xs;
    throw std::invalid_argument(s.str());
  }
  return d;
}